

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  uint uVar1;
  char *pcVar2;
  string *psVar3;
  uint __val;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  lts_20250127 *this;
  size_type in_R9;
  uint __len;
  long lVar7;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view s;
  string_view s_00;
  string_view s_01;
  FixedMapping replacements;
  FixedMapping replacements_00;
  FixedMapping replacements_01;
  string local_f8;
  string __str;
  string c_name;
  string php_name;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  pcVar2 = (desc->all_names_).payload_;
  this = (lts_20250127 *)(ulong)*(ushort *)(pcVar2 + 2);
  s._M_len = pcVar2 + ~(ulong)this;
  __str._M_dataplus._M_p = (pointer)0x1;
  __str._M_string_length =
       (long)
       "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
       + 0x77;
  __str.field_2._M_allocated_capacity = 1;
  __str.field_2._8_8_ = (long)"a2_" + 2;
  s._M_str = (char *)&__str;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&c_name,this,s,replacements);
  __str.field_2._M_allocated_capacity = 0;
  __str._M_dataplus._M_p = (pointer)0x0;
  __str._M_string_length = 0;
  __str.field_2._8_8_ = 0x1423710;
  FullClassName<google::protobuf::EnumDescriptor>(&local_f8,desc,(Options *)&__str);
  local_50._M_len = 1;
  local_50._M_str = "\\";
  local_40 = 2;
  local_38 = "\\\\";
  s_00._M_str = (char *)&local_50;
  s_00._M_len = (size_t)local_f8._M_dataplus._M_p;
  replacements_00._M_len = in_R9;
  replacements_00._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&php_name,(lts_20250127 *)local_f8._M_string_length,s_00,replacements_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__str._M_string_length);
  local_50._M_str = (desc->all_names_).payload_;
  local_50._M_len = (size_t)*(ushort *)(local_50._M_str + 2);
  local_50._M_str = local_50._M_str + ~local_50._M_len;
  psVar3 = desc->file_->name_;
  __str._M_dataplus._M_p = (pointer)0x1;
  __str._M_string_length =
       (long)
       "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
       + 0x77;
  __str.field_2._M_allocated_capacity = 1;
  __str.field_2._8_8_ = (long)"a2_" + 2;
  s_01._M_str = (char *)&__str;
  s_01._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
  replacements_01._M_len = in_R9;
  replacements_01._M_array = (iterator)0x2;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&local_f8,(lts_20250127 *)psVar3->_M_string_length,s_01,replacements_01);
  text._M_str = 
  "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev =\n      upb_EnumDef_FindValueByNumber(e, value);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(upb_EnumValueDef_Name(ev));\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n      e, name, name_len);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(upb_EnumValueDef_Number(ev));\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
  ;
  text._M_len = 0x734;
  io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,text,(char (*) [5])0x10a9ad3,&local_50,(char (*) [12])"file_c_name",&local_f8,
             (char (*) [7])0x13002e8,&c_name,(char (*) [9])"php_name",&php_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (0 < desc->value_count_) {
    lVar7 = 0;
    do {
      psVar3 = desc->values_[lVar7].all_names_;
      local_f8._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
      local_f8._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
      uVar1 = desc->values_[lVar7].number_;
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            __len = __len - 2;
            goto LAB_00e0e55b;
          }
          if (uVar5 < 1000) {
            __len = __len - 1;
            goto LAB_00e0e55b;
          }
          if (uVar5 < 10000) goto LAB_00e0e55b;
          uVar6 = uVar6 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar5);
        __len = __len + 1;
      }
LAB_00e0e55b:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
      text_00._M_str =
           "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
      ;
      text_00._M_len = 0x77;
      io::Printer::
      Print<char[7],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string>
                (printer,text_00,(char (*) [7])0x13002e8,&c_name,(char (*) [5])0x10a9ad3,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_f8,
                 (char (*) [4])0x115ee32,&__str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < desc->value_count_);
  }
  text_01._M_str = "}\n\n";
  text_01._M_len = 3;
  io::Printer::Print<>(printer,text_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)php_name._M_dataplus._M_p != &php_name.field_2) {
    operator_delete(php_name._M_dataplus._M_p,php_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)c_name._M_dataplus._M_p != &c_name.field_2) {
    operator_delete(c_name._M_dataplus._M_p,c_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(desc, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev =\n"
      "      upb_EnumDef_FindValueByNumber(e, value);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT "
      "\".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(upb_EnumValueDef_Name(ev));\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n"
      "      e, name, name_len);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(upb_EnumValueDef_Number(ev));\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(), "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name, "name", value->name(), "num",
        std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}